

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_misc_test.cc
# Opt level: O2

void __thiscall
BloatyTest_MultiThreaded_Test::BloatyTest_MultiThreaded_Test(BloatyTest_MultiThreaded_Test *this)

{
  BloatyTest::BloatyTest(&this->super_BloatyTest);
  (this->super_BloatyTest).super_Test._vptr_Test = (_func_int **)&PTR__BloatyTest_005f6eb8;
  return;
}

Assistant:

TEST_F(BloatyTest, MultiThreaded) {
  RunBloaty({"bloaty", "02-section-count-overflow.o"});
  size_t file_size = top_row_->size.file;

  // Bloaty doesn't know or care that you are passing the same file multiple
  // times.
  std::vector<std::string> args{"bloaty"};
  const int count = 100;
  for (int i = 0; i < count; i++) {
    args.push_back("02-section-count-overflow.o");
  }
  RunBloaty(args);  // Heavily multithreaded test.
  EXPECT_EQ(top_row_->size.file, file_size * 100);
}